

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ActionBlockSyntax::setChild(ActionBlockSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  StatementSyntax *pSVar2;
  logic_error *this_00;
  long lVar3;
  allocator<char> local_e1;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (index == 1) {
    pSVar1 = TokenOrSyntax::node(&child);
    lVar3 = 0x18;
    if (pSVar1 != (SyntaxNode *)0x0) {
      pSVar1 = TokenOrSyntax::node(&child);
      pSVar2 = (StatementSyntax *)SyntaxNode::as<slang::syntax::ElseClauseSyntax>(pSVar1);
      goto LAB_0023f369;
    }
  }
  else {
    if (index != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
                 ,&local_e1);
      std::operator+(&local_a0,&local_c0,":");
      std::__cxx11::to_string(&local_e0,0x253);
      std::operator+(&local_80,&local_a0,&local_e0);
      std::operator+(&local_60,&local_80,": ");
      std::operator+(&local_40,&local_60,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pSVar1 = TokenOrSyntax::node(&child);
    lVar3 = 0x10;
    if (pSVar1 != (SyntaxNode *)0x0) {
      pSVar1 = TokenOrSyntax::node(&child);
      pSVar2 = SyntaxNode::as<slang::syntax::StatementSyntax>(pSVar1);
      goto LAB_0023f369;
    }
  }
  pSVar2 = (StatementSyntax *)0x0;
LAB_0023f369:
  *(StatementSyntax **)((long)&(this->super_SyntaxNode).parent + lVar3) = pSVar2;
  return;
}

Assistant:

void ActionBlockSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: statement = child.node() ? &child.node()->as<StatementSyntax>() : nullptr; return;
        case 1: elseClause = child.node() ? &child.node()->as<ElseClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}